

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# norm2allmodes.h
# Opt level: O3

UBool __thiscall
icu_63::Normalizer2WithImpl::getDecomposition
          (Normalizer2WithImpl *this,UChar32 c,UnicodeString *decomposition)

{
  short sVar1;
  UBool UVar2;
  int32_t length_00;
  int32_t length;
  UChar buffer [4];
  int32_t local_3c;
  ConstChar16Ptr local_38 [3];
  UChar local_20 [4];
  
  local_38[0].p_ = Normalizer2Impl::getDecomposition(this->impl,c,local_20,&local_3c);
  if (local_38[0].p_ == (UChar *)0x0) {
    UVar2 = '\0';
  }
  else {
    if (local_38[0].p_ == local_20) {
      UnicodeString::unBogus(decomposition);
      sVar1 = (decomposition->fUnion).fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        length_00 = (decomposition->fUnion).fFields.fLength;
      }
      else {
        length_00 = (int)sVar1 >> 5;
      }
      UnicodeString::doReplace(decomposition,0,length_00,local_20,0,local_3c);
    }
    else {
      UnicodeString::setTo(decomposition,'\0',local_38,local_3c);
    }
    UVar2 = '\x01';
  }
  return UVar2;
}

Assistant:

virtual UBool
    getDecomposition(UChar32 c, UnicodeString &decomposition) const {
        UChar buffer[4];
        int32_t length;
        const UChar *d=impl.getDecomposition(c, buffer, length);
        if(d==NULL) {
            return FALSE;
        }
        if(d==buffer) {
            decomposition.setTo(buffer, length);  // copy the string (Jamos from Hangul syllable c)
        } else {
            decomposition.setTo(FALSE, d, length);  // read-only alias
        }
        return TRUE;
    }